

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardware.cpp
# Opt level: O0

void Cmd_vid_listmodes(FCommandLine *argv,APlayerPawn *who,int key)

{
  IVideo *pIVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int printlevel;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  byte local_49;
  byte local_42;
  byte local_29;
  int ratio;
  bool thisMode;
  uint uStack_24;
  bool letterbox;
  int bits;
  int height;
  int width;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  if (Video != (IVideo *)0x0) {
    height = key;
    _width = who;
    who_local = (APlayerPawn *)argv;
    for (ratio = 1; iVar4 = ratio, pIVar1 = Video, ratio < 0x21; ratio = ratio + 1) {
      uVar3 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x21])();
      (*pIVar1->_vptr_IVideo[5])(pIVar1,(ulong)(uint)iVar4,(ulong)(uVar3 & 1));
      while (uVar3 = (*Video->_vptr_IVideo[6])(Video,&bits,&stack0xffffffffffffffdc,&local_29),
            (uVar3 & 1) != 0) {
        bVar7 = false;
        if ((bits == DisplayWidth) && (bVar7 = false, uStack_24 == DisplayHeight)) {
          bVar7 = ratio == DisplayBits;
        }
        iVar4 = CheckRatio(bits,uStack_24,(int *)0x0);
        printlevel = 2;
        if (bVar7) {
          printlevel = 200;
        }
        local_42 = 1;
        if (!bVar7) {
          bVar2 = IsRatioWidescreen(iVar4);
          local_42 = bVar2 ^ 0xff;
        }
        pcVar5 = "\x1cF";
        if ((local_42 & 1) != 0) {
          pcVar5 = "";
        }
        local_49 = 1;
        if (!bVar7) {
          local_49 = local_29 ^ 0xff;
        }
        pcVar6 = "\x1cE LB";
        if ((local_49 & 1) != 0) {
          pcVar6 = "";
        }
        Printf(printlevel,"%s%4d x%5d x%3d%s%s\n",pcVar5,(ulong)(uint)bits,(ulong)uStack_24,
               (ulong)(uint)ratio,Cmd_vid_listmodes::ratios[iVar4],pcVar6);
      }
    }
  }
  return;
}

Assistant:

CCMD (vid_listmodes)
{
	static const char *ratios[7] = { "", " - 16:9", " - 16:10", "", " - 5:4", "", " - 21:9" };
	int width, height, bits;
	bool letterbox;

	if (Video == NULL)
	{
		return;
	}
	for (bits = 1; bits <= 32; bits++)
	{
		Video->StartModeIterator (bits, screen->IsFullscreen());
		while (Video->NextMode (&width, &height, &letterbox))
		{
			bool thisMode = (width == DisplayWidth && height == DisplayHeight && bits == DisplayBits);
			int ratio = CheckRatio (width, height);
			Printf (thisMode ? PRINT_BOLD : PRINT_HIGH,
				"%s%4d x%5d x%3d%s%s\n",
				thisMode || !IsRatioWidescreen(ratio) ? "" : TEXTCOLOR_GOLD,
				width, height, bits,
				ratios[ratio],
				thisMode || !letterbox ? "" : TEXTCOLOR_BROWN " LB"
				);
		}
	}
}